

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
GetSetterFromDescriptor<false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_local;
  
  if ((descriptor->Attributes & 0x18) == 0) {
    if ((descriptor->Attributes & 0x10) == 0) {
      if ((descriptor->Attributes & 4) == 0) {
        if ((descriptor->Attributes & 0x80) == 0) {
          this_local._4_4_ = Data;
        }
        else {
          this_local._4_4_ = Const|Data;
        }
      }
      else {
        this_local._4_4_ = WritableData;
      }
    }
    else if ((descriptor->Attributes & 0x80) == 0) {
      if ((descriptor->Attributes & 0x40) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x5fc,"(descriptor->Attributes & 0x40)",
                                    "descriptor->Attributes & PropertyLet");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_local._4_4_ = WritableData;
    }
    else {
      this_local._4_4_ = Const|Data;
    }
  }
  else {
    this_local._4_4_ = None;
  }
  return this_local._4_4_;
}

Assistant:

DescriptorFlags SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetSetterFromDescriptor(SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor)
    {
        if (descriptor->Attributes & (PropertyDeleted | (!allowLetConstGlobal ? PropertyLetConstGlobal : 0)))
        {
            return None;
        }

        if (descriptor->Attributes & PropertyLetConstGlobal)
        {
            if (descriptor->Attributes & PropertyConst)
            {
                return (DescriptorFlags)(Const|Data);
            }
            Assert(descriptor->Attributes & PropertyLet);
            return WritableData;
        }

        if (descriptor->Attributes & PropertyWritable)
        {
            return WritableData;
        }

        if (descriptor->Attributes & PropertyConst)
        {
            return (DescriptorFlags)(Const|Data);
        }

        return Data;
    }